

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O0

int getDeviceType(uint devNumber)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  allocator local_49;
  string local_48 [8];
  string boardDescription;
  FT_STATUS local_28;
  uint local_24;
  int board;
  DWORD numDevs;
  FT_DEVICE_LIST_INFO_NODE *devInfo;
  uint local_10;
  FT_STATUS ftStatus;
  uint devNumber_local;
  
  local_24 = 0;
  local_28 = 0xfffffffe;
  local_10 = devNumber;
  devInfo._4_4_ = FT_CreateDeviceInfoList(&local_24);
  if (devInfo._4_4_ == 0) {
    if (local_10 < local_24) {
      _board = malloc((ulong)local_24 * 0x68);
      devInfo._4_4_ = FT_GetDeviceInfoList(_board,&local_24);
      if (devInfo._4_4_ == 0) {
        pcVar1 = (char *)((long)_board + (ulong)local_10 * 0x68 + 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,pcVar1,&local_49);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"Alchitry Cu A");
        if (bVar2) {
          local_28 = 2;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,"Alchitry Au A");
          if (bVar2) {
            local_28 = 0;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_48,"Alchitry Au+ A");
            if (bVar2) {
              local_28 = 1;
            }
            else {
              local_28 = 0xffffffff;
            }
          }
        }
        std::__cxx11::string::~string(local_48);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error getting device list!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      free(_board);
      ftStatus = local_28;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid device number!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      ftStatus = 0xfffffffe;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Could not read device list!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    ftStatus = 0xfffffffe;
  }
  return ftStatus;
}

Assistant:

int getDeviceType(unsigned int devNumber) {
    FT_STATUS ftStatus;
    FT_DEVICE_LIST_INFO_NODE *devInfo;
    DWORD numDevs = 0;
    int board = BOARD_ERROR;
    // create the device information list
    ftStatus = FT_CreateDeviceInfoList(&numDevs);
    if (ftStatus != FT_OK) {
        cerr << "Could not read device list!" << endl;
        return BOARD_ERROR;
    }

    if (numDevs <= devNumber) {
        cerr << "Invalid device number!" << endl;
        return BOARD_ERROR;
    }

    // allocate storage for list based on numDevs
    devInfo = (FT_DEVICE_LIST_INFO_NODE *) malloc(
            sizeof(FT_DEVICE_LIST_INFO_NODE) * numDevs);
    // get the device information list
    ftStatus = FT_GetDeviceInfoList(devInfo, &numDevs);
    if (ftStatus == FT_OK) {
        string boardDescription = devInfo[devNumber].Description;
        if (boardDescription == "Alchitry Cu A") {
            board = BOARD_CU;
        } else if (boardDescription == "Alchitry Au A") {
            board = BOARD_AU;
        } else if (boardDescription == "Alchitry Au+ A") {
            board = BOARD_AU_PLUS;
        } else {
            board = BOARD_UNKNOWN;
        }
    } else {
        cerr << "Error getting device list!" << endl;
    }
    free(devInfo);

    return board;
}